

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

size_t allocate_tmp_space(estate s,FFSBuffer buf,size_t length,int req_alignment,
                         size_t *tmp_data_loc)

{
  size_t *psVar1;
  int iVar2;
  internal_iovec *piVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  uint uVar7;
  
  uVar7 = req_alignment - (int)s->output_len & req_alignment - 1U;
  ensure_writev_room(s,(int)buf);
  __n = (size_t)(int)uVar7;
  sVar5 = add_to_tmp_buffer(buf,length + __n);
  if (sVar5 == 0xffffffffffffffff) {
    sVar5 = 0xffffffffffffffff;
  }
  else {
    if (uVar7 != 0) {
      piVar3 = s->iovec;
      iVar2 = s->iovcnt;
      if (piVar3[(long)iVar2 + -1].iov_base == (void *)0x0) {
        memset((void *)((long)buf->tmp_buffer + sVar5),0,__n);
        sVar5 = sVar5 + __n;
        psVar1 = &s->iovec[(long)s->iovcnt + -1].iov_len;
        *psVar1 = *psVar1 + __n;
      }
      else {
        piVar3[iVar2].iov_len = __n;
        piVar3[iVar2].iov_offset = 0;
        piVar3[iVar2].iov_base = zeroes;
        s->iovcnt = iVar2 + 1;
      }
    }
    lVar4 = s->output_len;
    lVar6 = lVar4;
    if (tmp_data_loc != (size_t *)0x0) {
      *tmp_data_loc = sVar5;
      lVar6 = s->output_len;
    }
    sVar5 = lVar4 + __n;
    s->output_len = lVar6 + length + __n;
  }
  return sVar5;
}

Assistant:

size_t
allocate_tmp_space(estate s, FFSBuffer buf, size_t length, int req_alignment, size_t *tmp_data_loc)
{
    int pad = (req_alignment - s->output_len) & (req_alignment -1);  /*  only works if req_align is power of two */
    size_t tmp_data, msg_offset;
    switch (req_alignment) {
    case 1: case 2: case 4: case 8: case 16: break;
    default:
	assert(0);
    }
    ensure_writev_room(s, 2);
    tmp_data = add_to_tmp_buffer(buf, length + pad);
    if (tmp_data == (size_t)-1) return (size_t) -1;
    if (pad != 0) {
	if (s->iovec[s->iovcnt-1].iov_base == NULL) {
	    /* last was tmp too */
	    memset((char*)buf->tmp_buffer + tmp_data, 0, pad);	/* zero pad */
	    tmp_data += pad;
	    s->iovec[s->iovcnt-1].iov_len += pad;
	} else {
	    s->iovec[s->iovcnt].iov_len = pad;
	    s->iovec[s->iovcnt].iov_offset = 0;
	    s->iovec[s->iovcnt].iov_base = zeroes;
	    s->iovcnt++;
	}
    }
    msg_offset = s->output_len + pad;
    if (tmp_data_loc) *tmp_data_loc = tmp_data;
    s->output_len += length + pad;
    return msg_offset;
}